

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

uchar readuchar(FILE *f)

{
  undefined8 in_RAX;
  size_t sVar1;
  uchar c1;
  
  c1 = (uchar)((ulong)in_RAX >> 0x38);
  sVar1 = fread(&c1,1,1,(FILE *)f);
  if (sVar1 == 0) {
    fwrite("\nError: fread return a number of element different from the expected.\n",0x46,1,_stderr
          );
    c1 = '\0';
  }
  return c1;
}

Assistant:

static unsigned char readuchar(FILE * f)
{
    unsigned char c1;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    return c1;
}